

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall
soul::RenderingVenue::Pimpl::SessionImpl::render(SessionImpl *this,uint32_t numFrames)

{
  bool bVar1;
  uint *puVar2;
  pointer pPVar3;
  type pPVar4;
  undefined1 local_50 [8];
  OutputActions actions_1;
  undefined1 local_30 [8];
  InputActions actions;
  uint local_18;
  uint local_14;
  uint framesToDo;
  uint32_t numFrames_local;
  SessionImpl *this_local;
  
  local_14 = numFrames;
  _framesToDo = this;
  bVar1 = std::operator!=(&this->beginNextBlockCallback,(nullptr_t)0x0);
  if (bVar1) {
    std::function<void_(unsigned_int)>::operator()(&this->beginNextBlockCallback,local_14);
  }
  do {
    if (local_14 == 0) {
      return;
    }
    puVar2 = std::min<unsigned_int>(&this->maxBlockSize,&local_14);
    local_18 = *puVar2;
    bVar1 = std::operator!=(&this->getBlockSizeCallback,(nullptr_t)0x0);
    if (bVar1) {
      actions.perf._4_4_ =
           std::function<unsigned_int_(unsigned_int)>::operator()
                     (&this->getBlockSizeCallback,local_18);
      puVar2 = std::min<unsigned_int>(&local_18,(uint *)((long)&actions.perf + 4));
      local_18 = *puVar2;
      if (local_18 == 0) {
        throwInternalCompilerError("render",0x19d);
      }
    }
    pPVar3 = std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::operator->
                       (&this->performer);
    (**(code **)(*(long *)pPVar3 + 0x68))(pPVar3,local_18);
    bVar1 = std::operator!=(&this->preRenderCallback,(nullptr_t)0x0);
    if (bVar1) {
      pPVar4 = std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::operator*
                         (&this->performer);
      InputActions::InputActions((InputActions *)local_30,pPVar4);
      std::function<void_(soul::Venue::Session::InputEndpointActions_&,_unsigned_int)>::operator()
                (&this->preRenderCallback,(InputEndpointActions *)local_30,local_18);
      InputActions::~InputActions((InputActions *)local_30);
    }
    pPVar3 = std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::operator->
                       (&this->performer);
    (**(code **)(*(long *)pPVar3 + 0xa8))();
    bVar1 = std::operator!=(&this->postRenderCallback,(nullptr_t)0x0);
    if (bVar1) {
      pPVar4 = std::unique_ptr<soul::Performer,_std::default_delete<soul::Performer>_>::operator*
                         (&this->performer);
      OutputActions::OutputActions((OutputActions *)local_50,pPVar4);
      std::function<void_(soul::Venue::Session::OutputEndpointActions_&,_unsigned_int)>::operator()
                (&this->postRenderCallback,(OutputEndpointActions *)local_50,local_18);
      OutputActions::~OutputActions((OutputActions *)local_50);
    }
    std::__atomic_base<unsigned_long>::operator+=
              (&(this->totalFramesRendered).super___atomic_base<unsigned_long>,(ulong)local_18);
    local_14 = local_14 - local_18;
  } while( true );
}

Assistant:

void render (uint32_t numFrames)
        {
            if (beginNextBlockCallback != nullptr)
                beginNextBlockCallback (numFrames);

            while (numFrames != 0)
            {
                auto framesToDo = std::min (maxBlockSize, numFrames);

                if (getBlockSizeCallback != nullptr)
                {
                    framesToDo = std::min (framesToDo, getBlockSizeCallback (framesToDo));

                    if (framesToDo == 0)
                    {
                        SOUL_ASSERT_FALSE; // should handle this error case?
                        break;
                    }
                }

                performer->prepare (framesToDo);

                if (preRenderCallback != nullptr)
                {
                    InputActions actions (*performer);
                    preRenderCallback (actions, framesToDo);
                }

                performer->advance();

                if (postRenderCallback != nullptr)
                {
                    OutputActions actions (*performer);
                    postRenderCallback (actions, framesToDo);
                }

                totalFramesRendered += framesToDo;
                numFrames -= framesToDo;
            }
        }